

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  Pgno PVar2;
  MemPage *pPage;
  BtShared *pBVar3;
  u8 *puVar4;
  byte bVar5;
  PgHdr *pPg;
  uint uVar6;
  Pgno *pOld;
  uchar *puVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uchar *puVar12;
  uint uVar13;
  ulong uVar14;
  uchar *puVar15;
  undefined4 in_register_00000084;
  ulong uVar16;
  BtCursor *pBVar17;
  long lVar18;
  u32 uVar19;
  Pgno ovfl;
  int iVar20;
  Pgno nextPage;
  DbPage *pDbPage;
  Pgno local_74;
  uchar *local_70;
  uint local_64;
  BtCursor *local_60;
  ulong local_58;
  ulong local_50;
  BtShared *local_48;
  uint local_3c;
  PgHdr *local_38;
  
  local_50 = CONCAT44(in_register_00000084,eOp);
  uVar16 = (ulong)amt;
  pPage = pCur->apPage[pCur->iPage];
  pBVar3 = pCur->pBt;
  local_60 = pCur;
  if ((pCur->info).nSize == 0) {
    btreeParseCellPtr(pPage,pPage->aData +
                            (CONCAT11(pPage->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2],
                                      pPage->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2 + 1]) &
                            pPage->maskPage),&pCur->info);
    local_60->curFlags = local_60->curFlags | 2;
  }
  puVar4 = (local_60->info).pPayload;
  uVar1 = (local_60->info).nLocal;
  uVar8 = 0xdf72;
  if (pPage->aData + pBVar3->usableSize < puVar4 + uVar1) goto LAB_00126d22;
  uVar6 = (uint)uVar1;
  local_48 = pBVar3;
  if (uVar6 < offset || uVar6 - offset == 0) {
    uVar11 = (ulong)(offset - uVar6);
    iVar20 = 0;
  }
  else {
    uVar19 = uVar6 - offset;
    if (amt + offset <= (uint)uVar1) {
      uVar19 = amt;
    }
    puVar7 = puVar4 + offset;
    local_70 = pBuf;
    local_58 = uVar16;
    if (((local_50 & 1) == 0) ||
       (iVar20 = sqlite3PagerWrite(pPage->pDbPage), puVar7 = local_70, pBuf = puVar4 + offset,
       puVar15 = local_70, iVar20 == 0)) {
      puVar15 = local_70;
      memcpy(pBuf,puVar7,(long)(int)uVar19);
      iVar20 = 0;
    }
    pBuf = puVar15 + (int)uVar19;
    uVar16 = (ulong)((int)local_58 - uVar19);
    uVar11 = 0;
  }
  if ((iVar20 == 0) && ((int)uVar16 != 0)) {
    local_64 = local_48->usableSize - 4;
    uVar14 = (ulong)local_64;
    uVar1 = (local_60->info).nLocal;
    uVar6 = *(uint *)(puVar4 + uVar1);
    ovfl = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    iVar20 = 0;
    bVar5 = 1;
    pBVar17 = local_60;
    local_74 = ovfl;
    local_70 = pBuf;
    if (((int)local_50 != 2) && ((local_60->curFlags & 4) == 0)) {
      iVar20 = 0;
      uVar6 = (((local_48->usableSize - (uint)uVar1) + (local_60->info).nPayload) - 5) / local_64;
      pOld = local_60->aOverflow;
      local_58 = uVar16;
      if (local_60->nOvflAlloc < (int)uVar6) {
        pOld = (Pgno *)sqlite3Realloc(pOld,(long)(int)(uVar6 * 2) << 2);
        if (pOld != (Pgno *)0x0) {
          local_60->nOvflAlloc = uVar6 * 2;
          local_60->aOverflow = pOld;
          goto LAB_00126b6c;
        }
        iVar20 = 7;
        bVar5 = 0;
        pBVar17 = local_60;
      }
      else {
LAB_00126b6c:
        pBVar17 = local_60;
        memset(pOld,0,(long)(int)uVar6 << 2);
        puVar4 = &pBVar17->curFlags;
        *puVar4 = *puVar4 | 4;
        bVar5 = 1;
      }
      uVar14 = (ulong)local_64;
      uVar16 = local_58;
    }
    if ((pBVar17->curFlags & 4) == 0) {
      lVar18 = 0;
    }
    else {
      lVar18 = 0;
      if (pBVar17->aOverflow[uVar11 / uVar14] != 0) {
        lVar18 = (long)(int)(uVar11 / uVar14);
        ovfl = pBVar17->aOverflow[lVar18];
        uVar11 = uVar11 % uVar14;
        local_74 = ovfl;
      }
    }
    if ((bool)(bVar5 & ovfl != 0)) {
      uVar6 = (uint)local_50 & 1;
      local_50 = (ulong)uVar6;
      local_3c = uVar6 * 2 ^ 2;
      lVar18 = lVar18 << 2;
      puVar7 = local_70;
      do {
        uVar6 = (uint)uVar11;
        if ((pBVar17->curFlags & 4) != 0) {
          *(Pgno *)((long)pBVar17->aOverflow + lVar18) = ovfl;
        }
        uVar13 = (uint)uVar14;
        uVar9 = uVar6 - uVar13;
        if (uVar6 < uVar13) {
          iVar10 = uVar13 - uVar6;
          if ((int)uVar16 + uVar6 <= uVar13) {
            iVar10 = (int)uVar16;
          }
          local_70 = puVar7;
          local_58 = uVar16;
          iVar20 = sqlite3PagerAcquire(local_48->pPager,ovfl,&local_38,local_3c);
          pPg = local_38;
          uVar9 = uVar6;
          if (iVar20 == 0) {
            puVar12 = (uchar *)((ulong)(uVar6 + 4) + (long)local_38->pData);
            uVar6 = *local_38->pData;
            ovfl = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
            puVar7 = puVar12;
            puVar15 = local_70;
            local_74 = ovfl;
            if (((int)local_50 == 0) ||
               (iVar20 = sqlite3PagerWrite(local_38), puVar7 = local_70, puVar15 = puVar12,
               iVar20 == 0)) {
              memcpy(puVar15,puVar7,(long)iVar10);
              iVar20 = 0;
            }
            sqlite3PagerUnrefNotNull(pPg);
            uVar9 = 0;
          }
          uVar16 = (ulong)(uint)((int)local_58 - iVar10);
          puVar7 = local_70 + iVar10;
          uVar14 = (ulong)local_64;
          pBVar17 = local_60;
        }
        else {
          PVar2 = *(Pgno *)((long)pBVar17->aOverflow + lVar18 + 4);
          if (PVar2 == 0) {
            iVar20 = getOverflowPage(local_48,ovfl,(MemPage **)0x0,&local_74);
            uVar14 = (ulong)local_64;
            pBVar17 = local_60;
            ovfl = local_74;
          }
          else {
            iVar20 = 0;
            ovfl = PVar2;
            local_74 = PVar2;
          }
        }
        if ((iVar20 != 0) || ((int)uVar16 == 0)) break;
        lVar18 = lVar18 + 4;
        uVar11 = (ulong)uVar9;
      } while (ovfl != 0);
    }
  }
  if (iVar20 != 0) {
    return iVar20;
  }
  uVar8 = 0xe00d;
  if ((int)uVar16 == 0) {
    return 0;
  }
LAB_00126d22:
  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar8,
              "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
  return 0xb;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->apPage[pCur->iPage]; /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;
  int bEnd;                                 /* True if reading to end of data */
#endif

  assert( pPage );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->aiIdx[pCur->iPage]<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );
  assert( eOp!=2 || offset==0 );    /* Always start from beginning for eOp==2 */

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  bEnd = offset+amt==pCur->info.nPayload;
#endif
  assert( offset+amt <= pCur->info.nPayload );

  if( &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize] ){
    /* Trying to read or write past the end of the data is an error */
    return SQLITE_CORRUPT_BKPT;
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, (eOp & 0x01), pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    ** Except, do not allocate aOverflow[] for eOp==2.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( eOp!=2 && (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( nOvfl>pCur->nOvflAlloc ){
        Pgno *aNew = (Pgno*)sqlite3Realloc(
            pCur->aOverflow, nOvfl*2*sizeof(Pgno)
        );
        if( aNew==0 ){
          rc = SQLITE_NOMEM;
        }else{
          pCur->nOvflAlloc = nOvfl*2;
          pCur->aOverflow = aNew;
        }
      }
      if( rc==SQLITE_OK ){
        memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
        pCur->curFlags |= BTCF_ValidOvfl;
      }
    }

    /* If the overflow page-list cache has been allocated and the
    ** entry for the first required overflow page is valid, skip
    ** directly to it.
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)!=0
     && pCur->aOverflow[offset/ovflSize]
    ){
      iIdx = (offset/ovflSize);
      nextPage = pCur->aOverflow[iIdx];
      offset = (offset%ovflSize);
    }

    for( ; rc==SQLITE_OK && amt>0 && nextPage; iIdx++){

      /* If required, populate the overflow page-list cache. */
      if( (pCur->curFlags & BTCF_ValidOvfl)!=0 ){
        assert(!pCur->aOverflow[iIdx] || pCur->aOverflow[iIdx]==nextPage);
        pCur->aOverflow[iIdx] = nextPage;
      }

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        **
        ** Note that the aOverflow[] array must be allocated because eOp!=2
        ** here.  If eOp==2, then offset==0 and this branch is never taken.
        */
        assert( eOp!=2 );
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
        sqlite3_file *fd;
#endif
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) the database is file-backed, and
        **   4) there is no open write-transaction, and
        **   5) the database is not a WAL database,
        **   6) all data from the page is being read.
        **   7) at least 4 bytes have already been read into the output buffer 
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( (eOp&0x01)==0                                      /* (1) */
         && offset==0                                          /* (2) */
         && (bEnd || a==ovflSize)                              /* (6) */
         && pBt->inTransaction==TRANS_READ                     /* (4) */
         && (fd = sqlite3PagerFile(pBt->pPager))->pMethods     /* (3) */
         && pBt->pPage1->aData[19]==0x01                       /* (5) */
         && &pBuf[-4]>=pBufStart                               /* (7) */
        ){
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* hence (7) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerAcquire(pBt->pPager, nextPage, &pDbPage,
              ((eOp&0x01)==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, (eOp&0x01), pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        pBuf += a;
      }
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  return rc;
}